

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gzip_test.cpp
# Opt level: O1

void __thiscall unit_test::unit_test(unit_test *this,service *s)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  url_dispatcher *puVar2;
  string local_38;
  
  cppcms::application::application(&this->super_application,s);
  *(undefined ***)this = &PTR__application_00108bc0;
  puVar2 = (url_dispatcher *)cppcms::application::dispatcher();
  paVar1 = &local_38.field_2;
  local_38._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_38,"/ca","");
  cppcms::url_dispatcher::assign<unit_test>(puVar2,&local_38,0x104930,(unit_test *)0x0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != paVar1) {
    operator_delete(local_38._M_dataplus._M_p);
  }
  puVar2 = (url_dispatcher *)cppcms::application::dispatcher();
  local_38._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_38,"/cb","");
  cppcms::url_dispatcher::assign<unit_test>(puVar2,&local_38,0x104954,(unit_test *)0x0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != paVar1) {
    operator_delete(local_38._M_dataplus._M_p);
  }
  puVar2 = (url_dispatcher *)cppcms::application::dispatcher();
  local_38._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_38,"/cbig","");
  cppcms::url_dispatcher::assign<unit_test>(puVar2,&local_38,0x10498a,(unit_test *)0x0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != paVar1) {
    operator_delete(local_38._M_dataplus._M_p);
  }
  puVar2 = (url_dispatcher *)cppcms::application::dispatcher();
  local_38._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_38,"/bin","");
  cppcms::url_dispatcher::assign<unit_test>(puVar2,&local_38,0x104a00,(unit_test *)0x0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != paVar1) {
    operator_delete(local_38._M_dataplus._M_p);
  }
  puVar2 = (url_dispatcher *)cppcms::application::dispatcher();
  local_38._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_38,"/not","");
  cppcms::url_dispatcher::assign<unit_test>(puVar2,&local_38,0x104aa0,(unit_test *)0x0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != paVar1) {
    operator_delete(local_38._M_dataplus._M_p);
  }
  return;
}

Assistant:

unit_test(cppcms::service &s) : cppcms::application(s)
	{
		dispatcher().assign("/ca",&unit_test::compressed_a,this);
		dispatcher().assign("/cb",&unit_test::compressed_b,this);
		dispatcher().assign("/cbig",&unit_test::compressed_big,this);
		dispatcher().assign("/bin",&unit_test::binary,this);
		dispatcher().assign("/not",&unit_test::not_compressed,this);
	}